

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O0

GetOpt_pp * __thiscall
GetOpt::GetOpt_pp::operator>>(GetOpt_pp *this,_func_ios_base_ptr_ios_base_ptr *iomanip)

{
  fmtflags fVar1;
  long *plVar2;
  long local_1a0;
  stringstream ss;
  ostream local_190 [376];
  _func_ios_base_ptr_ios_base_ptr *local_18;
  _func_ios_base_ptr_ios_base_ptr *iomanip_local;
  GetOpt_pp *this_local;
  
  local_18 = iomanip;
  iomanip_local = (_func_ios_base_ptr_ios_base_ptr *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::ios_base::flags((ios_base *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)),this->_flags);
  plVar2 = (long *)std::ostream::operator<<(local_190,(_func_ios_base_ptr_ios_base_ptr *)local_18);
  fVar1 = std::ios_base::flags((ios_base *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  this->_flags = fVar1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  return this;
}

Assistant:

GETOPT_INLINE GetOpt_pp& GetOpt_pp::operator >> (std::ios_base & (*iomanip)(std::ios_base&))
{
    std::stringstream ss;
    ss.flags(_flags);
    _flags = (ss << iomanip).flags();
    return *this;
}